

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

float __thiscall Imath_3_2::Matrix33<float>::determinant(Matrix33<float> *this)

{
  Matrix33<float> *this_local;
  
  return this->x[0][2] * (this->x[1][0] * this->x[2][1] + -(this->x[1][1] * this->x[2][0])) +
         this->x[0][0] * (this->x[1][1] * this->x[2][2] + -(this->x[1][2] * this->x[2][1])) +
         this->x[0][1] * (this->x[1][2] * this->x[2][0] + -(this->x[1][0] * this->x[2][2]));
}

Assistant:

IMATH_HOSTDEVICE constexpr inline T
Matrix33<T>::determinant () const IMATH_NOEXCEPT
{
    return x[0][0] * (x[1][1] * x[2][2] - x[1][2] * x[2][1]) +
           x[0][1] * (x[1][2] * x[2][0] - x[1][0] * x[2][2]) +
           x[0][2] * (x[1][0] * x[2][1] - x[1][1] * x[2][0]);
}